

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapoke.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint32_t uVar1;
  char cVar2;
  int iVar3;
  nva_err err;
  long lStack_58;
  int e;
  uint64_t step;
  uint64_t val;
  uint32_t local_40;
  uint32_t b;
  uint32_t a;
  int unit;
  nva_regspace rs;
  int c;
  char **argv_local;
  int argc_local;
  
  iVar3 = nva_init();
  if (iVar3 == 0) {
    memset(&a,0,0x18);
    while (rs.idx = getopt(argc,argv,"c:i:b:t:"), rs.idx != -1) {
      switch(rs.idx) {
      case 0x62:
        __isoc99_sscanf(_optarg,"%d",&rs.cnum);
        if ((((rs.cnum != 1) && (rs.cnum != 2)) && (rs.cnum != 4)) && (rs.cnum != 8)) {
          fprintf(_stderr,"Invalid size.\n");
          return 1;
        }
        break;
      case 99:
        __isoc99_sscanf(_optarg,"%d",&rs);
        break;
      case 0x69:
        __isoc99_sscanf(_optarg,"%d",&rs.type);
        break;
      case 0x74:
        rs.card._4_4_ = nva_rstype(_optarg);
        if (rs.card._4_4_ == 0x15) {
          fprintf(_stderr,"Unknown register space.\n");
          return 1;
        }
      }
    }
    if ((int)rs.card < nva_cardsnum) {
      _a = nva_cards[(int)rs.card];
      if (rs.cnum == 0) {
        rs.cnum = nva_rsdefsz((nva_regspace *)&a);
      }
      b = nva_rsunitsz((nva_regspace *)&a);
      val._4_4_ = rs.cnum / (int)b;
      lStack_58 = 0;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&local_40);
        if (_optind + 1 < argc) {
          if (_optind + 2 < argc) {
            __isoc99_sscanf(argv[_optind + 1],"%x",(long)&val + 4);
            __isoc99_sscanf(argv[_optind + 2],"%lx",&step);
          }
          else {
            __isoc99_sscanf(argv[_optind + 1],"%lx",&step);
          }
          if (_optind + 3 < argc) {
            __isoc99_sscanf(argv[_optind + 3],"%lx",&stack0xffffffffffffffa8);
          }
          for (; val._4_4_ != 0; val._4_4_ = val._4_4_ - rs.cnum / (int)b) {
            err = nva_wr((nva_regspace *)&a,local_40,step);
            uVar1 = local_40;
            if (err != NVA_ERR_SUCCESS) {
              cVar2 = nva_rserrc(err);
              printf("%08x: ERR %c\n",(ulong)uVar1,(ulong)(uint)(int)cVar2);
            }
            local_40 = rs.cnum / (int)b + local_40;
            step = lStack_58 + step;
          }
          argv_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"No value specified.\n");
          argv_local._4_4_ = 1;
        }
      }
      else {
        fprintf(_stderr,"No address specified.\n",(long)rs.cnum % (long)(int)b & 0xffffffff);
        argv_local._4_4_ = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	struct nva_regspace rs = { 0 };
	while ((c = getopt (argc, argv, "c:i:b:t:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &rs.cnum);
				break;
			case 'i':
				sscanf(optarg, "%d", &rs.idx);
				break;
			case 'b':
				sscanf(optarg, "%d", &rs.regsz);
				if (rs.regsz != 1 && rs.regsz != 2 && rs.regsz != 4 && rs.regsz != 8) {
					fprintf (stderr, "Invalid size.\n");
					return 1;
				}
				break;
			case 't':
				rs.type = nva_rstype(optarg);
				if (rs.type == NVA_REGSPACE_UNKNOWN) {
					fprintf (stderr, "Unknown register space.\n");
					return 1;
				}
				break;
		}
	if (rs.cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	rs.card = nva_cards[rs.cnum];
	if (rs.regsz == 0)
		rs.regsz = nva_rsdefsz(&rs);
	int unit = nva_rsunitsz(&rs);
	uint32_t a, b = rs.regsz/unit;
	uint64_t val, step = 0;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 >= argc) {
		fprintf (stderr, "No value specified.\n");
		return 1;
	}
	if (optind + 2 >= argc) {
		sscanf (argv[optind + 1], "%"SCNx64, &val);
	} else {
		sscanf (argv[optind + 1], "%x", &b);
		sscanf (argv[optind + 2], "%"SCNx64, &val);
	}
	if (optind + 3 < argc)
		sscanf (argv[optind + 3], "%"SCNx64, &step);
	while (b > 0) {
		int e = nva_wr(&rs, a, val);
		if (e)
			printf("%08x: ERR %c\n", a, nva_rserrc(e));
		a += rs.regsz/unit;
		b -= rs.regsz/unit;
		val += step;
	}
	return 0;
}